

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  stbi__result_info *in_R9;
  long in_FS_OFFSET;
  stbi__result_info ri;
  int in_stack_ffffffffffffffc8;
  int local_2c [3];
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,(int)local_2c,in_R9,in_stack_ffffffffffffffc8);
  if (__ptr == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else if (local_2c[0] != 8) {
    if (local_2c[0] != 0x10) {
      __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                    ,0x4f5,
                    "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                   );
    }
    iVar1 = *x;
    iVar2 = *y;
    uVar5 = iVar1 * iVar2 * 4;
    puVar3 = (uchar *)malloc((long)(int)uVar5);
    if (puVar3 == (uchar *)0x0) {
      *(char **)(in_FS_OFFSET + -8) = "outofmem";
      __ptr = puVar3;
    }
    else {
      if (0 < iVar1 * iVar2 * 4) {
        uVar4 = 0;
        do {
          puVar3[uVar4] = __ptr[uVar4 * 2 + 1];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      free(__ptr);
      __ptr = puVar3;
    }
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}